

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_source_over(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  int i_1;
  int i;
  ulong uVar5;
  
  uVar4 = 0;
  if (0 < length) {
    uVar4 = (ulong)(uint)length;
  }
  if (const_alpha == 0xff) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = src[uVar5];
      if (uVar1 < 0xff000000) {
        if (uVar1 != 0) {
          uVar2 = BYTE_MUL(dest[uVar5],~uVar1 >> 0x18);
          dest[uVar5] = uVar2 + uVar1;
        }
      }
      else {
        dest[uVar5] = uVar1;
      }
    }
  }
  else {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = BYTE_MUL(src[uVar5],const_alpha);
      uVar3 = BYTE_MUL(dest[uVar5],~uVar2 >> 0x18);
      dest[uVar5] = uVar3 + uVar2;
    }
  }
  return;
}

Assistant:

static void composition_source_over(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t s = src[i];
            if(s >= 0xff000000) {
                dest[i] = s;
            } else if (s != 0) {
                dest[i] = s + BYTE_MUL(dest[i], plutovg_alpha(~s));
            }
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = s + BYTE_MUL(dest[i], plutovg_alpha(~s));
        }
    }
}